

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertWeights
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          aiMatrix4x4 *node_global_transform,uint materialIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *outputVertStartIndices)

{
  pointer ppCVar1;
  Cluster *cl;
  uint *puVar2;
  pointer __first1;
  pointer __last1;
  uint uVar3;
  Skin *pSVar4;
  MatIndexArray *pMVar5;
  uint *puVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var7
  ;
  aiBone **__first2;
  uint *puVar8;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  Model *extraout_RDX_02;
  Model *extraout_RDX_03;
  Model *pMVar9;
  MeshGeometry *this_00;
  pointer ppCVar10;
  uint i;
  ulong uVar11;
  ulong __n;
  unsigned_long local_108;
  uint count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> count_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_out_indices;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  size_t no_index_sentinel;
  
  pSVar4 = Geometry::DeformerSkin(&geo->super_Geometry);
  if (pSVar4 == (Skin *)0x0) {
    __assert_fail("geo.DeformerSkin()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5b1,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4 = Geometry::DeformerSkin(&geo->super_Geometry);
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::reserve
            (&bones,(long)(pSVar4->clusters).
                          super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pSVar4->clusters).
                          super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (outputVertStartIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0 &&
      materialIndex != 0xffffffff) {
    __assert_fail("no_mat_check || outputVertStartIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5bd,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  ppCVar10 = (pSVar4->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (pSVar4->clusters).
            super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    __last1 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    __first1 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppCVar10 == ppCVar1) {
      if (bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar11 = (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        __n = -(ulong)(uVar11 >> 0x3d != 0) |
              (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        __first2 = (aiBone **)operator_new__(__n);
        memset(__first2,0,__n);
        out->mBones = __first2;
        out->mNumBones = (uint)uVar11;
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,aiBone**>
                  ((__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
                   __first1,(__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
                             )__last1,__first2);
      }
      std::_Vector_base<aiBone_*,_std::allocator<aiBone_*>_>::~_Vector_base
                (&bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&count_out_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&index_out_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    cl = *ppCVar10;
    if (cl == (Cluster *)0x0) {
      __assert_fail("cluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x5c2,
                    "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                   );
    }
    this_00 = geo;
    pMVar5 = MeshGeometry::GetMaterialIndices(geo);
    no_index_sentinel = 0xffffffffffffffff;
    if (count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    puVar2 = (cl->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pMVar9 = extraout_RDX;
    for (puVar8 = (cl->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
      count = 0;
      puVar6 = MeshGeometry::ToOutputVertexIndex(geo,*puVar8,&count);
      if (puVar6 == (uint *)0x0) {
        __assert_fail("out_idx != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x5d6,
                      "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                     );
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&index_out_indices,&no_index_sentinel);
      local_108 = 0;
      this_00 = (MeshGeometry *)&count_out_indices;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_108);
      pMVar9 = extraout_RDX_00;
      for (uVar11 = 0; uVar11 < count; uVar11 = uVar11 + 1) {
        if (materialIndex == 0xffffffff) {
LAB_00501ce0:
          if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1] == 0xffffffffffffffff) {
            index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1] =
                 (long)out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
          if (materialIndex == 0xffffffff) {
            local_108 = (unsigned_long)*puVar6;
            this_00 = (MeshGeometry *)&out_indices;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_108);
            pMVar9 = extraout_RDX_03;
          }
          else {
            _Var7 = std::
                    __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                              ((outputVertStartIndices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start,
                               (outputVertStartIndices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish,puVar6);
            local_108 = (long)_Var7._M_current -
                        (long)(outputVertStartIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2;
            this_00 = (MeshGeometry *)&out_indices;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_108);
            pMVar9 = extraout_RDX_02;
          }
          count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] =
               count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1] + 1;
        }
        else {
          this_00 = geo;
          uVar3 = MeshGeometry::FaceForVertexIndex(geo,*puVar6);
          pMVar9 = extraout_RDX_01;
          if ((long)(pMVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar3] == (ulong)materialIndex)
          goto LAB_00501ce0;
        }
        puVar6 = puVar6 + 1;
      }
    }
    ConvertCluster((FBXConverter *)this_00,&bones,pMVar9,cl,&out_indices,&index_out_indices,
                   &count_out_indices,node_global_transform);
    ppCVar10 = ppCVar10 + 1;
  } while( true );
}

Assistant:

void FBXConverter::ConvertWeights(aiMesh* out, const Model& model, const MeshGeometry& geo,
            const aiMatrix4x4& node_global_transform,
            unsigned int materialIndex,
            std::vector<unsigned int>* outputVertStartIndices)
        {
            ai_assert(geo.DeformerSkin());

            std::vector<size_t> out_indices;
            std::vector<size_t> index_out_indices;
            std::vector<size_t> count_out_indices;

            const Skin& sk = *geo.DeformerSkin();

            std::vector<aiBone*> bones;
            bones.reserve(sk.Clusters().size());

            const bool no_mat_check = materialIndex == NO_MATERIAL_SEPARATION;
            ai_assert(no_mat_check || outputVertStartIndices);

            try {

                for (const Cluster* cluster : sk.Clusters()) {
                    ai_assert(cluster);

                    const WeightIndexArray& indices = cluster->GetIndices();

                    const MatIndexArray& mats = geo.GetMaterialIndices();

                    const size_t no_index_sentinel = std::numeric_limits<size_t>::max();

                    count_out_indices.clear();
                    index_out_indices.clear();
                    out_indices.clear();

                    // now check if *any* of these weights is contained in the output mesh,
                    // taking notes so we don't need to do it twice.
                    for (WeightIndexArray::value_type index : indices) {

                        unsigned int count = 0;
                        const unsigned int* const out_idx = geo.ToOutputVertexIndex(index, count);
                        // ToOutputVertexIndex only returns NULL if index is out of bounds
                        // which should never happen
                        ai_assert(out_idx != NULL);

                        index_out_indices.push_back(no_index_sentinel);
                        count_out_indices.push_back(0);

                        for (unsigned int i = 0; i < count; ++i) {
                            if (no_mat_check || static_cast<size_t>(mats[geo.FaceForVertexIndex(out_idx[i])]) == materialIndex) {

                                if (index_out_indices.back() == no_index_sentinel) {
                                    index_out_indices.back() = out_indices.size();
                                }

                                if (no_mat_check) {
                                    out_indices.push_back(out_idx[i]);
                                } else {
                                    // this extra lookup is in O(logn), so the entire algorithm becomes O(nlogn)
                                    const std::vector<unsigned int>::iterator it = std::lower_bound(
                                        outputVertStartIndices->begin(),
                                        outputVertStartIndices->end(),
                                        out_idx[i]
                                    );

                                    out_indices.push_back(std::distance(outputVertStartIndices->begin(), it));
                                }

                                ++count_out_indices.back();                               
                            }
                        }
                    }
                    
                    // if we found at least one, generate the output bones
                    // XXX this could be heavily simplified by collecting the bone
                    // data in a single step.
                    ConvertCluster(bones, model, *cluster, out_indices, index_out_indices,
                            count_out_indices, node_global_transform);
                }
            }
            catch (std::exception&) {
                std::for_each(bones.begin(), bones.end(), Util::delete_fun<aiBone>());
                throw;
            }

            if (bones.empty()) {
                return;
            }

            out->mBones = new aiBone*[bones.size()]();
            out->mNumBones = static_cast<unsigned int>(bones.size());

            std::swap_ranges(bones.begin(), bones.end(), out->mBones);
        }